

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem_generator.cpp
# Opt level: O1

void __thiscall
franca::TypeDefinitionGenerator::TypeDefinitionGenerator(TypeDefinitionGenerator *this)

{
  karma_rule<fidler::ast::TypeDefinition_()> *pkVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  karma_rule<fidler::ast::ArrayType_()> *pkVar4;
  size_type sVar5;
  TypeGenerator *pTVar6;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>
  that_1;
  undefined1 *local_148;
  karma_rule<fidler::ast::ArrayType_()> *local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [24];
  undefined1 local_110 [8];
  karma_rule<fidler::ast::ArrayType_()> *local_108;
  TypeGenerator *local_100;
  undefined1 local_f8 [16];
  karma_rule<fidler::ast::ArrayType_()> local_e8;
  undefined1 local_9a [2];
  ExpressionGenerator *local_98;
  TypeGenerator *local_90;
  karma_rule<fidler::ast::TypeDefinition_()> *local_88;
  undefined1 *local_80;
  karma_rule<fidler::ast::ArrayType_()> *local_78;
  undefined1 *local_70;
  vtable_base local_68;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_60;
  char *local_58;
  karma_rule<fidler::ast::ArrayType_()> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  proto_child0 local_38;
  
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-grammar","");
  pkVar1 = &this->type_definition_;
  (this->super_karma_grammar<fidler::ast::TypeDefinition_()>).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pkVar1;
  psVar2 = &(this->super_karma_grammar<fidler::ast::TypeDefinition_()>).name_;
  paVar3 = &(this->super_karma_grammar<fidler::ast::TypeDefinition_()>).name_.field_2;
  (this->super_karma_grammar<fidler::ast::TypeDefinition_()>).name_._M_dataplus._M_p =
       (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>((string *)psVar2,local_148,local_148 + (long)local_140);
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_148 = local_138;
  local_48._M_allocated_capacity = (size_type)paVar3;
  local_48._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-rule","");
  (this->type_definition_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pkVar1;
  (this->type_definition_).name_._M_dataplus._M_p = (pointer)&(this->type_definition_).name_.field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->type_definition_).name_,local_148,local_148 + (long)local_140);
  (this->type_definition_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_90 = &this->type_;
  local_88 = pkVar1;
  TypeGenerator::TypeGenerator(local_90);
  local_98 = &this->expression_;
  ExpressionGenerator::ExpressionGenerator(local_98);
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-rule","");
  pkVar4 = &this->array_type_;
  (this->array_type_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = pkVar4;
  (this->array_type_).name_._M_dataplus._M_p = (pointer)&(this->array_type_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->array_type_).name_,local_148,local_148 + (long)local_140);
  (this->array_type_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_148 = local_138;
  local_50 = pkVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-rule","");
  local_e8.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor._16_8_ = &this->enumeration_type_;
  (this->enumeration_type_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_e8.f.
          super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
          .super_function_base.functor._16_8_;
  (this->enumeration_type_).name_._M_dataplus._M_p =
       (pointer)&(this->enumeration_type_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->enumeration_type_).name_,local_148,local_148 + (long)local_140);
  (this->enumeration_type_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::EnumerationType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-rule","");
  local_e8.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor._8_8_ = &this->struct_type_;
  (this->struct_type_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_e8.f.
          super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
          .super_function_base.functor._8_8_;
  (this->struct_type_).name_._M_dataplus._M_p = (pointer)&(this->struct_type_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->struct_type_).name_,local_148,local_148 + (long)local_140);
  (this->struct_type_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::StructType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-rule","");
  local_e8.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor.members.obj_ptr = &this->union_type_;
  (this->union_type_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_e8.f.
          super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
          .super_function_base.functor.members._0_8_;
  (this->union_type_).name_._M_dataplus._M_p = (pointer)&(this->union_type_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->union_type_).name_,local_148,local_148 + (long)local_140);
  (this->union_type_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::UnionType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-rule","");
  local_e8.f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)&this->map_type_;
  (this->map_type_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_e8.f.
          super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
          .super_function_base.vtable;
  (this->map_type_).name_._M_dataplus._M_p = (pointer)&(this->map_type_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->map_type_).name_,local_148,local_148 + (long)local_140);
  (this->map_type_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::MapType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-rule","");
  local_e8.name_.field_2._8_8_ = &this->alias_type_;
  (this->alias_type_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_e8.name_.field_2._8_8_;
  (this->alias_type_).name_._M_dataplus._M_p = (pointer)&(this->alias_type_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->alias_type_).name_,local_148,local_148 + (long)local_140);
  (this->alias_type_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::AliasType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-rule","");
  local_e8.name_.field_2._M_allocated_capacity = (size_type)&this->enumerator_;
  (this->enumerator_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_e8.name_.field_2._M_allocated_capacity;
  (this->enumerator_).name_._M_dataplus._M_p = (pointer)&(this->enumerator_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->enumerator_).name_,local_148,local_148 + (long)local_140);
  (this->enumerator_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Enumerator_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unnamed-rule","");
  local_e8.name_._M_string_length = (size_type)&this->field_;
  (this->field_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_e8.name_._M_string_length;
  (this->field_).name_._M_dataplus._M_p = (pointer)&(this->field_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->field_).name_,local_148,local_148 + (long)local_140);
  (this->field_).f.
  super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::Field_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  pTVar6 = local_90;
  local_128._0_8_ = &local_108;
  local_100 = (TypeGenerator *)
              local_e8.f.
              super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
              .super_function_base.functor._16_8_;
  local_128._16_8_ = local_128;
  local_128._8_8_ =
       local_e8.f.
       super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
       .super_function_base.functor._8_8_;
  local_f8._0_8_ = local_128 + 0x10;
  local_110 = (undefined1  [8])
              local_e8.f.
              super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
              .super_function_base.functor.members._0_8_;
  local_f8._8_8_ =
       local_e8.f.
       super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
       .super_function_base.vtable;
  local_140 = (karma_rule<fidler::ast::ArrayType_()> *)local_e8.name_.field_2._8_8_;
  local_148 = local_f8;
  local_108 = pkVar4;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,boost::variant<fidler::ast::ArrayType,fidler::ast::EnumerationType,fidler::ast::StructType,fidler::ast::UnionType,fidler::ast::MapType,fidler::ast::AliasType>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::ArrayType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::EnumerationType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::StructType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::UnionType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::MapType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::AliasType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (local_88);
  local_128._0_8_ = "  array ";
  local_128._8_8_ = &boost::spirit::standard::string;
  local_128._16_8_ = local_128;
  local_110 = (undefined1  [8])0x3f4896;
  local_f8._0_8_ = local_128 + 0x10;
  local_f8._8_8_ = pTVar6;
  local_108._0_1_ = '\n';
  local_140 = (karma_rule<fidler::ast::ArrayType_()> *)&local_108;
  local_148 = local_f8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::ArrayType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[9]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>const&,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (pkVar4);
  local_128._0_8_ = "  typedef ";
  local_128._8_8_ = &boost::spirit::standard::string;
  local_128._16_8_ = local_128;
  local_110 = (undefined1  [8])0x3f48a6;
  local_f8._0_8_ = local_128 + 0x10;
  local_f8._8_8_ = pTVar6;
  local_108 = (karma_rule<fidler::ast::ArrayType_()> *)CONCAT71(local_108._1_7_,10);
  local_140 = (karma_rule<fidler::ast::ArrayType_()> *)&local_108;
  local_148 = local_f8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::AliasType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[11]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>const&,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_e8.name_.field_2._8_8_);
  local_108 = (karma_rule<fidler::ast::ArrayType_()> *)0x3f48ab;
  local_100 = (TypeGenerator *)&boost::spirit::standard::string;
  local_e8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x3eec96;
  local_e8.name_._M_dataplus._M_p = &boost::spirit::standard::string;
  local_128._0_8_ = &local_108;
  local_128._16_8_ = local_128;
  local_110 = (undefined1  [8])((long)"  contract\n  {\n" + 10);
  local_60.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )local_e8.name_.field_2._M_allocated_capacity;
  local_f8._0_8_ = local_128 + 0x10;
  local_140 = (karma_rule<fidler::ast::ArrayType_()> *)0x3faa72;
  local_148 = local_f8;
  local_128._8_8_ = &local_78;
  local_f8._8_8_ = (karma_rule<fidler::ast::ArrayType_()> *)&local_60;
  local_78 = &local_e8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::EnumerationType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[15]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>>
            (local_e8.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.functor._16_8_);
  sVar5 = local_e8.name_._M_string_length;
  local_e8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x3f48ba;
  local_e8.name_._M_dataplus._M_p = &boost::spirit::standard::string;
  local_78 = (karma_rule<fidler::ast::ArrayType_()> *)0x3eec96;
  local_70 = &boost::spirit::standard::string;
  local_100 = (TypeGenerator *)&local_68;
  local_80 = local_9a;
  local_9a[0] = 1;
  local_60.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_80;
  local_58 = " polymorphic";
  local_128._0_8_ = &local_108;
  local_128._16_8_ = local_128;
  local_110 = (undefined1  [8])((long)"  contract\n  {\n" + 10);
  local_f8._8_8_ = &local_38;
  local_38.ref.t_ =
       (reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_e8.name_._M_string_length;
  local_f8._0_8_ = local_128 + 0x10;
  local_148 = local_f8;
  local_140 = (karma_rule<fidler::ast::ArrayType_()> *)0x3faa72;
  local_128._8_8_ = (karma_rule<fidler::ast::ArrayType_()> *)&local_60;
  local_108 = &local_e8;
  local_68.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_78;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::StructType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift___s_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>>
            (local_e8.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.functor._8_8_);
  local_108 = (karma_rule<fidler::ast::ArrayType_()> *)0x3f48d1;
  local_100 = (TypeGenerator *)&boost::spirit::standard::string;
  local_e8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x3eec96;
  local_e8.name_._M_dataplus._M_p = &boost::spirit::standard::string;
  local_128._0_8_ = &local_108;
  local_128._16_8_ = local_128;
  local_110 = (undefined1  [8])((long)"  contract\n  {\n" + 10);
  local_60.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )sVar5;
  local_f8._0_8_ = local_128 + 0x10;
  local_140 = (karma_rule<fidler::ast::ArrayType_()> *)0x3faa72;
  local_148 = local_f8;
  local_128._8_8_ = &local_78;
  local_f8._8_8_ = (karma_rule<fidler::ast::ArrayType_()> *)&local_60;
  local_78 = &local_e8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::UnionType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[9]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Field(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>>
            (local_e8.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.functor.members.obj_ptr);
  local_e8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x3f48da;
  local_e8.name_._M_dataplus._M_p = &boost::spirit::standard::string;
  local_100 = (TypeGenerator *)0x3f48e1;
  local_128._0_8_ = &local_108;
  local_128._8_8_ = pTVar6;
  local_128._16_8_ = local_128;
  local_110 = (undefined1  [8])0x3f48e5;
  local_f8._0_8_ = local_128 + 0x10;
  local_f8._8_8_ = pTVar6;
  local_140 = (karma_rule<fidler::ast::ArrayType_()> *)0x3faa73;
  local_148 = local_f8;
  local_108 = &local_e8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::MapType(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>const&,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>const&,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>>,2l>>
            (local_e8.f.
             super_function3<bool,_boost::spirit::karma::detail::output_iterator<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_&,_boost::spirit::context<boost::fusion::cons<const_fidler::ast::ArrayType_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
             .super_function_base.vtable);
  local_108 = (karma_rule<fidler::ast::ArrayType_()> *)((long)"          " + 6);
  local_100 = pTVar6;
  local_60.proto_expr_.child0.ref.t_._0_1_ = 1;
  local_e8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_78;
  local_e8.name_._M_dataplus._M_p = "[]";
  local_128._0_8_ = &local_108;
  local_68.manager._0_1_ = 0x20;
  local_128._16_8_ = local_128;
  local_110 = (undefined1  [8])&local_68;
  local_f8._0_8_ = local_128 + 0x10;
  local_f8._8_8_ = &boost::spirit::standard::string;
  local_80 = (undefined1 *)CONCAT71(local_80._1_7_,10);
  local_140 = (karma_rule<fidler::ast::ArrayType_()> *)&local_80;
  local_148 = local_f8;
  local_128._8_8_ = &local_e8;
  local_78 = (karma_rule<fidler::ast::ArrayType_()> *)&local_60;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Field(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>,franca::TypeGenerator&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,boost::fusion::vector<bool>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_e8.name_._M_string_length);
  local_128._16_8_ = "    ";
  local_110 = (undefined1  [8])&boost::spirit::standard::string;
  local_128._0_8_ = " = ";
  local_128._8_8_ = local_98;
  local_108 = (karma_rule<fidler::ast::ArrayType_()> *)local_128;
  local_f8._0_8_ = local_128 + 0x10;
  local_f8._8_8_ = &local_108;
  local_e8.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_._0_1_ = 10;
  local_148 = local_f8;
  local_140 = &local_e8;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>,franca::ExpressionGenerator&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_e8.name_.field_2._M_allocated_capacity);
  return;
}

Assistant:

TypeDefinitionGenerator::TypeDefinitionGenerator() :
		TypeDefinitionGenerator::base_type(type_definition_)
{
	namespace karma = boost::spirit::karma;

	type_definition_
		%= array_type_
		| enumeration_type_
		| struct_type_
		| union_type_
		| map_type_
		| alias_type_
		;

	array_type_
		%= "  array "
		<< karma::string
		<< " of "
		<< type_
		<< '\n'
		;

	alias_type_
		%= "  typedef "
		<< karma::string
		<< " is "
		<< type_
		<< '\n'
		;

	enumeration_type_
		%= "  enumeration "
		<< karma::string
		<< -(" extends " << karma::string)
		<< "\n  {\n"
		<< *enumerator_
		<< "  }\n"
		;

	struct_type_
		%= "  struct "
		<< karma::string
		<< -(" extends " << karma::string)
		<< (!karma::bool_(true) | " polymorphic")
		<< "\n  {\n"
		<< *field_
		<< "  }\n"
		;

	union_type_
		%= "  union "
		<< karma::string
		<< -(" extends " << karma::string)
		<< "\n  {\n"
		<< *field_
		<< "  }\n"
		;

	map_type_
		%= "  map "
		<< karma::string
		<< " { "
		<< type_
		<< " to "
		<< type_
		<< " }\n"
		;

	field_
		%= "    "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< '\n'
		;

	enumerator_
		%= "    "
		<< karma::string
		<< -(" = " << expression_)
		<< '\n'
		;
}